

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expr * __thiscall kratos::Var::duplicate(Var *this,uint32_t count)

{
  int iVar1;
  undefined4 extraout_var;
  Expr *pEVar2;
  shared_ptr<kratos::Expr> local_50 [2];
  Var *local_30;
  undefined1 local_28 [8];
  shared_ptr<kratos::VarDuplicated> expr;
  uint32_t count_local;
  Var *this_local;
  
  local_30 = this;
  expr.super___shared_ptr<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = count;
  std::make_shared<kratos::VarDuplicated,kratos::Var*,unsigned_int&>
            ((Var **)local_28,(uint *)&local_30);
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])();
  std::shared_ptr<kratos::Expr>::shared_ptr<kratos::VarDuplicated,void>
            (local_50,(shared_ptr<kratos::VarDuplicated> *)local_28);
  Generator::add_expr((Generator *)CONCAT44(extraout_var,iVar1),local_50);
  std::shared_ptr<kratos::Expr>::~shared_ptr(local_50);
  pEVar2 = &std::
            __shared_ptr_access<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<kratos::VarDuplicated,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28)->super_Expr;
  std::shared_ptr<kratos::VarDuplicated>::~shared_ptr((shared_ptr<kratos::VarDuplicated> *)local_28)
  ;
  return pEVar2;
}

Assistant:

Expr &Var::duplicate(uint32_t count) const {
    auto expr = std::make_shared<VarDuplicated>(const_cast<Var *>(this), count);
    generator()->add_expr(expr);
    return *expr;
}